

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O0

DWORD WaitForSingleObjectEx(HANDLE hHandle,DWORD dwMilliseconds,BOOL bAlertable)

{
  DWORD DVar1;
  CPalThread *pThread_00;
  CPalThread *pThread;
  DWORD dwRet;
  BOOL bAlertable_local;
  DWORD dwMilliseconds_local;
  HANDLE hHandle_local;
  
  _bAlertable_local = hHandle;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  DVar1 = CorUnix::InternalWaitForMultipleObjectsEx
                    (pThread_00,1,(HANDLE *)&bAlertable_local,0,dwMilliseconds,bAlertable);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return DVar1;
}

Assistant:

DWORD
PALAPI
WaitForSingleObjectEx(IN HANDLE hHandle,
                      IN DWORD dwMilliseconds,
                      IN BOOL bAlertable)
{
    DWORD dwRet;

    PERF_ENTRY(WaitForSingleObjectEx);
    ENTRY("WaitForSingleObjectEx(hHandle=%p, dwMilliseconds=%u, bAlertable=%s)\n",
          hHandle, dwMilliseconds, bAlertable ? "TRUE" : "FALSE");

    CPalThread * pThread = InternalGetCurrentThread();

    dwRet = InternalWaitForMultipleObjectsEx(pThread, 1, &hHandle, FALSE,
                                             dwMilliseconds, bAlertable);

    LOGEXIT("WaitForSingleObjectEx returns DWORD %u\n", dwRet);
    PERF_EXIT(WaitForSingleObjectEx);
    return dwRet;
}